

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper * __thiscall
Js::JavascriptLibrary::CreateRemainingElementsWrapper_TTD
          (JavascriptLibrary *this,ScriptContext *ctx,uint32 value)

{
  Recycler *pRVar1;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar2;
  TrackAllocData local_50;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElementsWrapper;
  ScriptContext *pSStack_18;
  uint32 value_local;
  ScriptContext *ctx_local;
  JavascriptLibrary *this_local;
  
  remainingElementsWrapper._4_4_ = value;
  pSStack_18 = ctx;
  ctx_local = (ScriptContext *)this;
  pRVar1 = ScriptContext::GetRecycler(ctx);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,
             (type_info *)
             &JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1615);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_50);
  pJVar2 = (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)
           new<Memory::Recycler>(4,pRVar1,0x744a10);
  pJVar2->remainingElements = remainingElementsWrapper._4_4_;
  return pJVar2;
}

Assistant:

JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* JavascriptLibrary::CreateRemainingElementsWrapper_TTD(Js::ScriptContext* ctx, uint32 value)
    {
        JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElementsWrapper = RecyclerNewStructZ(ctx->GetRecycler(), JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper);
        remainingElementsWrapper->remainingElements = value;

        return remainingElementsWrapper;
    }